

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1617eac::TNoContractionAssigneeCheckingTraverser::visitBinary
          (TNoContractionAssigneeCheckingTraverser *this,TVisit param_1,TIntermBinary *node)

{
  TOperator TVar1;
  size_t __n;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  undefined4 extraout_var_00;
  long *plVar4;
  long lVar5;
  mapped_type *pmVar6;
  undefined4 extraout_var_01;
  undefined4 in_register_00000034;
  TIntermBinary *local_20;
  
  iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(node,CONCAT44(in_register_00000034,param_1));
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar2),this);
  local_20 = node;
  sVar3 = std::
          _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&this->accesschain_mapping_->_M_h,(key_type *)&local_20);
  if (sVar3 != 0) {
    TVar1 = (node->super_TIntermOperator).op;
    if ((3 < TVar1 - EOpIndexDirect) && (TVar1 != EOpMatrixSwizzle)) {
      __assert_fail("isDereferenceOperation(node->getOp())",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x248,
                    "virtual bool (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::visitBinary(glslang::TVisit, glslang::TIntermBinary *)"
                   );
    }
    iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xf0))
                               ((long *)CONCAT44(extraout_var_00,iVar2));
    lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
    if ((*(byte *)(lVar5 + 0xc) & 0x10) == 0) {
      local_20 = node;
      pmVar6 = std::__detail::
               _Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this->accesschain_mapping_,(key_type *)&local_20);
      __n = pmVar6->_M_string_length;
      if (__n != this->precise_object_->_M_string_length) {
        return false;
      }
      if ((__n != 0) &&
         (iVar2 = bcmp((pmVar6->_M_dataplus)._M_p,(this->precise_object_->_M_dataplus)._M_p,__n),
         iVar2 != 0)) {
        return false;
      }
    }
    iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1f])(node);
    lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x50))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) | 0x1000000000;
  }
  return false;
}

Assistant:

bool TNoContractionAssigneeCheckingTraverser::visitBinary(glslang::TVisit,
                                                          glslang::TIntermBinary* node)
{
    // Traverses the left so that we transfer the 'precise' from nesting object
    // to its nested object.
    node->getLeft()->traverse(this);
    // If this binary node is an object node, we should have it in the
    // accesschain_mapping_.
    if (accesschain_mapping_.count(node)) {
        // A binary object node must be a dereference node.
        assert(isDereferenceOperation(node->getOp()));
        // If the left node is 'precise', this node should also be precise,
        // otherwise, compare with the given precise_object_. If the
        // access chain of this node matches with the given precise_object_,
        // this node should be marked as 'precise'.
        if (isPreciseObjectNode(node->getLeft())) {
            node->getWritableType().getQualifier().noContraction = true;
        } else if (accesschain_mapping_.at(node) == *precise_object_) {
            node->getWritableType().getQualifier().noContraction = true;
        }
    }
    return false;
}